

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

void __thiscall duckdb_parquet::LogicalType::printTo(LogicalType *this,ostream *out)

{
  uint uVar1;
  _LogicalType__isset _Var2;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"LogicalType(",0xc);
  std::__ostream_insert<char,std::char_traits<char>>(out,"STRING=",7);
  _Var2 = this->__isset;
  if (((ushort)_Var2 & 1) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::StringType>(&local_40,&this->STRING);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_40._M_dataplus._M_p,local_40._M_string_length);
  }
  if ((((ushort)_Var2 & 1) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2)) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"MAP=",4);
  _Var2 = this->__isset;
  if (((ushort)_Var2 & 2) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::MapType>(&local_60,&this->MAP);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_60._M_dataplus._M_p,local_60._M_string_length);
  }
  if ((((ushort)_Var2 & 2) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2)) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"LIST=",5);
  _Var2 = this->__isset;
  if (((ushort)_Var2 & 4) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::ListType>(&local_80,&this->LIST);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_80._M_dataplus._M_p,local_80._M_string_length);
  }
  if ((((ushort)_Var2 & 4) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2)) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"ENUM=",5);
  _Var2 = this->__isset;
  if (((ushort)_Var2 & 8) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::EnumType>(&local_a0,&this->ENUM);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_a0._M_dataplus._M_p,local_a0._M_string_length);
  }
  if ((((ushort)_Var2 & 8) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2)) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"DECIMAL=",8);
  _Var2 = this->__isset;
  if (((ushort)_Var2 & 0x10) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::DecimalType>(&local_c0,&this->DECIMAL);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_c0._M_dataplus._M_p,local_c0._M_string_length);
  }
  if ((((ushort)_Var2 & 0x10) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2)) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"DATE=",5);
  _Var2 = this->__isset;
  if (((ushort)_Var2 & 0x20) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::DateType>(&local_e0,&this->DATE);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_e0._M_dataplus._M_p,local_e0._M_string_length);
  }
  if ((((ushort)_Var2 & 0x20) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2)) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"TIME=",5);
  _Var2 = this->__isset;
  if (((ushort)_Var2 & 0x40) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::TimeType>(&local_100,&this->TIME);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_100._M_dataplus._M_p,local_100._M_string_length);
  }
  if ((((ushort)_Var2 & 0x40) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2)) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"TIMESTAMP=",10);
  if (SUB21(this->__isset,0) < '\0') {
    duckdb_apache::thrift::to_string<duckdb_parquet::TimestampType>(&local_120,&this->TIMESTAMP);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_120._M_dataplus._M_p,local_120._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"INTEGER=",8);
  uVar1 = *(uint *)&this->__isset;
  if ((uVar1 >> 8 & 1) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::IntType>(&local_140,&this->INTEGER);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_140._M_dataplus._M_p,local_140._M_string_length);
  }
  if (((uVar1 >> 8 & 1) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2)) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"UNKNOWN=",8);
  uVar1 = *(uint *)&this->__isset;
  if ((uVar1 >> 9 & 1) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::NullType>(&local_160,&this->UNKNOWN);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_160._M_dataplus._M_p,local_160._M_string_length);
  }
  if (((uVar1 >> 9 & 1) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2)) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"JSON=",5);
  uVar1 = *(uint *)&this->__isset;
  if ((uVar1 >> 10 & 1) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::JsonType>(&local_180,&this->JSON);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_180._M_dataplus._M_p,local_180._M_string_length);
  }
  if (((uVar1 >> 10 & 1) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2)) {
    operator_delete(local_180._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"BSON=",5);
  uVar1 = *(uint *)&this->__isset;
  if ((uVar1 >> 0xb & 1) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::BsonType>(&local_1a0,&this->BSON);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_1a0._M_dataplus._M_p,local_1a0._M_string_length);
  }
  if (((uVar1 >> 0xb & 1) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2)) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"UUID=",5);
  uVar1 = *(uint *)&this->__isset;
  if ((uVar1 >> 0xc & 1) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::UUIDType>(&local_1c0,&this->UUID);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  }
  if (((uVar1 >> 0xc & 1) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2)) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"FLOAT16=",8);
  uVar1 = *(uint *)&this->__isset;
  if ((uVar1 >> 0xd & 1) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::Float16Type>(&local_1e0,&this->FLOAT16);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  }
  if (((uVar1 >> 0xd & 1) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2)) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,")",1);
  return;
}

Assistant:

void LogicalType::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "LogicalType(";
  out << "STRING="; (__isset.STRING ? (out << to_string(STRING)) : (out << "<null>"));
  out << ", " << "MAP="; (__isset.MAP ? (out << to_string(MAP)) : (out << "<null>"));
  out << ", " << "LIST="; (__isset.LIST ? (out << to_string(LIST)) : (out << "<null>"));
  out << ", " << "ENUM="; (__isset.ENUM ? (out << to_string(ENUM)) : (out << "<null>"));
  out << ", " << "DECIMAL="; (__isset.DECIMAL ? (out << to_string(DECIMAL)) : (out << "<null>"));
  out << ", " << "DATE="; (__isset.DATE ? (out << to_string(DATE)) : (out << "<null>"));
  out << ", " << "TIME="; (__isset.TIME ? (out << to_string(TIME)) : (out << "<null>"));
  out << ", " << "TIMESTAMP="; (__isset.TIMESTAMP ? (out << to_string(TIMESTAMP)) : (out << "<null>"));
  out << ", " << "INTEGER="; (__isset.INTEGER ? (out << to_string(INTEGER)) : (out << "<null>"));
  out << ", " << "UNKNOWN="; (__isset.UNKNOWN ? (out << to_string(UNKNOWN)) : (out << "<null>"));
  out << ", " << "JSON="; (__isset.JSON ? (out << to_string(JSON)) : (out << "<null>"));
  out << ", " << "BSON="; (__isset.BSON ? (out << to_string(BSON)) : (out << "<null>"));
  out << ", " << "UUID="; (__isset.UUID ? (out << to_string(UUID)) : (out << "<null>"));
  out << ", " << "FLOAT16="; (__isset.FLOAT16 ? (out << to_string(FLOAT16)) : (out << "<null>"));
  out << ")";
}